

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cShaderBitfieldOperationTests.cpp
# Opt level: O0

bool __thiscall
glcts::ShaderBitfieldOperationCaseBitfieldExtractUint::test
          (ShaderBitfieldOperationCaseBitfieldExtractUint *this,Data *data)

{
  uint local_38;
  int local_24;
  GLuint expected;
  int i;
  Data *data_local;
  ShaderBitfieldOperationCaseBitfieldExtractUint *this_local;
  
  local_24 = 0;
  while( true ) {
    if (this->m_components <= local_24) {
      return true;
    }
    if (data->bits == 0x20) {
      local_38 = 0xffffffff;
    }
    else {
      local_38 = (1 << ((byte)data->bits & 0x1f)) - 1;
    }
    if (data->outUvec4[local_24] !=
        (data->inUvec4[local_24] >> ((byte)data->offset & 0x1f) & local_38)) break;
    local_24 = local_24 + 1;
  }
  return false;
}

Assistant:

virtual bool test(Data const* data)
	{
		for (int i = 0; i < m_components; ++i)
		{
			GLuint expected =
				(data->inUvec4[i] >> data->offset) & (data->bits == 32 ? 0xFFFFFFFF : ((1 << data->bits) - 1));
			if (data->outUvec4[i] != expected)
			{
				return false;
			}
		}
		return true;
	}